

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O2

int EVP_DecodeBase64(uint8_t *out,size_t *out_len,size_t max_out,uint8_t *in,size_t in_len)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  size_t num_bytes_resulting;
  
  *out_len = 0;
  iVar1 = 0;
  if (((in_len & 3) == 0) && ((in_len >> 2) * 3 <= max_out)) {
    sVar3 = 0;
    for (uVar2 = 0; uVar2 < in_len; uVar2 = uVar2 + 4) {
      iVar1 = base64_decode_quad(out,&num_bytes_resulting,in + uVar2);
      if ((iVar1 == 0) || (in_len - 4 != uVar2 && num_bytes_resulting != 3)) {
        return 0;
      }
      out = out + num_bytes_resulting;
      sVar3 = sVar3 + num_bytes_resulting;
    }
    *out_len = sVar3;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int EVP_DecodeBase64(uint8_t *out, size_t *out_len, size_t max_out,
                     const uint8_t *in, size_t in_len) {
  *out_len = 0;

  if (in_len % 4 != 0) {
    return 0;
  }

  size_t max_len;
  if (!EVP_DecodedLength(&max_len, in_len) || max_out < max_len) {
    return 0;
  }

  size_t i, bytes_out = 0;
  for (i = 0; i < in_len; i += 4) {
    size_t num_bytes_resulting;

    if (!base64_decode_quad(out, &num_bytes_resulting, &in[i])) {
      return 0;
    }

    bytes_out += num_bytes_resulting;
    out += num_bytes_resulting;
    if (num_bytes_resulting != 3 && i != in_len - 4) {
      return 0;
    }
  }

  *out_len = bytes_out;
  return 1;
}